

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Supermap.hpp
# Opt level: O2

string * __thiscall
supermap::Supermap<supermap::Key<128ul>,supermap::ByteArray<4096ul>,unsigned_long>::
getNewBlockName_abi_cxx11_(string *__return_storage_ptr__,void *this)

{
  unsigned_long __val;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  std::operator+(&local_50,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)this + 0x88),"block-");
  __val = (**(code **)(*(long *)(*(long *)((long)this + 0x18) + 8) + 8))
                    (*(long *)((long)this + 0x18) + 8);
  std::__cxx11::to_string(&local_70,__val);
  std::operator+(&local_30,&local_50,&local_70);
  Supermap<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long>::addRandomString
            (__return_storage_ptr__,
             (Supermap<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long> *)this,
             &local_30,8);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  return __return_storage_ptr__;
}

Assistant:

[[nodiscard]] std::string getNewBlockName() const {
        return addRandomString(indexFilesPrefix + "block-" + std::to_string(diskIndex_->getItemsCount()));
    }